

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_not_slow(JSContext *ctx,JSValue *sp)

{
  JSValue val;
  int iVar1;
  long in_RSI;
  int32_t v1;
  undefined4 uStackY_44;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  JSContext *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int64_t in_stack_fffffffffffffff8;
  
  val.u._4_4_ = in_stack_fffffffffffffff4;
  val.u.int32 = in_stack_fffffffffffffff0;
  val.tag = in_stack_fffffffffffffff8;
  iVar1 = JS_ToInt32Free(in_stack_ffffffffffffffe8,
                         (int32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         val);
  if (iVar1 == 0) {
    *(ulong *)(in_RSI + -0x10) = CONCAT44(in_stack_fffffffffffffff4,~local_34);
    *(undefined8 *)(in_RSI + -8) = 0;
    iVar1 = 0;
  }
  else {
    *(ulong *)(in_RSI + -0x10) = (ulong)uStackY_44 << 0x20;
    *(undefined8 *)(in_RSI + -8) = 3;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static no_inline int js_not_slow(JSContext *ctx, JSValue *sp)
{
    int32_t v1;

    if (unlikely(JS_ToInt32Free(ctx, &v1, sp[-1]))) {
        sp[-1] = JS_UNDEFINED;
        return -1;
    }
    sp[-1] = JS_NewInt32(ctx, ~v1);
    return 0;
}